

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderArrow(ImVec2 p_min,ImGuiDir dir,float scale)

{
  ImDrawList *this;
  undefined4 uVar1;
  undefined4 uVar2;
  ImU32 col;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  if (dir + 1U < 6) {
    fVar7 = GImGui->FontSize * 0.4 * scale;
    switch(dir) {
    case 0:
      fVar7 = -fVar7;
    case 1:
      fVar8 = fVar7 * 0.75;
      fVar9 = fVar7 * 0.0;
      fVar5 = fVar7 * -0.75;
      fVar10 = fVar7 * 0.866;
      fVar6 = fVar7 * -0.866;
      fVar7 = fVar5;
      break;
    case 2:
      fVar7 = -fVar7;
    case 3:
      fVar8 = fVar7 * 0.0;
      fVar9 = fVar7 * 0.75;
      fVar5 = fVar7 * 0.866;
      fVar6 = fVar7 * -0.75;
      fVar7 = fVar7 * -0.866;
      fVar10 = fVar6;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                    ,0x9a5,"void ImGui::RenderArrow(ImVec2, ImGuiDir, float)");
    }
  }
  else {
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar8 = 0.0;
    fVar9 = 0.0;
    fVar7 = 0.0;
    fVar10 = 0.0;
  }
  fVar3 = GImGui->FontSize * 0.5;
  this = GImGui->CurrentWindow->DrawList;
  fVar4 = fVar3 + p_min.x;
  fVar3 = scale * fVar3 + p_min.y;
  local_40.x = fVar8 + fVar4;
  local_40.y = fVar9 + fVar3;
  local_48.y = fVar10 + fVar3;
  local_48.x = fVar7 + fVar4;
  local_50.y = fVar3 + fVar6;
  local_50.x = fVar4 + fVar5;
  local_38.x = (GImGui->Style).Colors[0].x;
  local_38.y = (GImGui->Style).Colors[0].y;
  uVar1 = (GImGui->Style).Colors[0].z;
  uVar2 = (GImGui->Style).Colors[0].w;
  local_38.w = (GImGui->Style).Alpha * (float)uVar2;
  local_38.z = (float)uVar1;
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddTriangleFilled(this,&local_40,&local_48,&local_50,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImVec2 p_min, ImGuiDir dir, float scale)
{
    ImGuiContext& g = *GImGui;

    const float h = g.FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f,+0.750f) * r;
        b = ImVec2(-0.866f,-0.750f) * r;
        c = ImVec2(+0.866f,-0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f,+0.000f) * r;
        b = ImVec2(-0.750f,+0.866f) * r;
        c = ImVec2(-0.750f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }

    g.CurrentWindow->DrawList->AddTriangleFilled(center + a, center + b, center + c, GetColorU32(ImGuiCol_Text));
}